

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O2

void AM_drawMarks(void)

{
  double dVar1;
  FTexture *tex;
  long lVar2;
  
  for (lVar2 = 0; lVar2 != 0x28; lVar2 = lVar2 + 4) {
    dVar1 = *(double *)((long)&markpoints[0].x + lVar2 * 4);
    if ((dVar1 != -1.0) || (NAN(dVar1))) {
      tex = FTextureManager::operator()
                      (&TexMan,(FTextureID)*(int *)((long)&marknums[0].texnum + lVar2),false);
      DrawMarker(tex,*(double *)((long)&markpoints[0].x + lVar2 * 4),
                 *(double *)((long)&markpoints[0].y + lVar2 * 4),-3,0,1.0,1.0,0,1.0,0,
                 LegacyRenderStyles[1]);
    }
  }
  return;
}

Assistant:

void AM_drawMarks ()
{
	for (int i = 0; i < AM_NUMMARKPOINTS; i++)
	{
		if (markpoints[i].x != -1)
		{
			DrawMarker (TexMan(marknums[i]), markpoints[i].x, markpoints[i].y, -3, 0,
				1, 1, 0, 1, 0, LegacyRenderStyles[STYLE_Normal]);
		}
	}
}